

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int i2c_process_call(int pi,uint handle,uint reg,uint32_t val)

{
  int iVar1;
  int in_ECX;
  gpioExtent_t *unaff_retaddr;
  int in_stack_00000008;
  gpioExtent_t ext [1];
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  iVar1 = pigpio_command_ext(in_ECX,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                             (int)((ulong)&stack0xfffffffffffffff0 >> 0x20),
                             (int)&stack0xfffffffffffffff0,0,unaff_retaddr,in_stack_00000008);
  return iVar1;
}

Assistant:

int i2c_process_call(int pi, unsigned handle, unsigned reg, uint32_t val)
{
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=reg
   p3=4
   ## extension ##
   uint32_t val
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &val;

   return pigpio_command_ext
      (pi, PI_CMD_I2CPK, handle, reg, 4, 1, ext, 1);
}